

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O2

void duckdb::FetchRowValidity
               (transaction_t start_time,transaction_t transaction_id,UpdateInfo *info,idx_t row_idx
               ,Vector *result,idx_t result_idx)

{
  UpdateInfo *current;
  UndoBufferPointer update_ptr;
  anon_class_24_3_1e69923c local_90;
  UndoBufferPointer local_78;
  idx_t local_68;
  idx_t local_60;
  UndoBufferReference local_58;
  
  local_68 = result_idx;
  local_60 = row_idx;
  FlatVector::VerifyFlatVector(result);
  local_90.result_mask = &result->validity;
  local_90.row_idx = &local_60;
  local_90.result_idx = &local_68;
  if ((start_time < (info->version_number).super___atomic_base<unsigned_long>._M_i) &&
     ((info->version_number).super___atomic_base<unsigned_long>._M_i != transaction_id)) {
    FetchRowValidity::anon_class_24_3_1e69923c::operator()(&local_90,info);
  }
  local_78.entry = (info->next).entry;
  local_78.position = (info->next).position;
  while (local_78.entry != (UndoBufferEntry *)0x0) {
    UndoBufferPointer::Pin(&local_58,&local_78);
    current = (UpdateInfo *)UndoBufferReference::Ptr(&local_58);
    if ((start_time < (current->version_number).super___atomic_base<unsigned_long>._M_i) &&
       ((current->version_number).super___atomic_base<unsigned_long>._M_i != transaction_id)) {
      FetchRowValidity::anon_class_24_3_1e69923c::operator()(&local_90,current);
    }
    local_78.entry = (current->next).entry;
    local_78.position = (current->next).position;
    BufferHandle::~BufferHandle(&local_58.handle);
  }
  return;
}

Assistant:

static void FetchRowValidity(transaction_t start_time, transaction_t transaction_id, UpdateInfo &info, idx_t row_idx,
                             Vector &result, idx_t result_idx) {
	auto &result_mask = FlatVector::Validity(result);
	UpdateInfo::UpdatesForTransaction(info, start_time, transaction_id, [&](UpdateInfo &current) {
		auto info_data = current.GetData<bool>();
		auto tuples = current.GetTuples();
		// FIXME: we could do a binary search in here
		for (idx_t i = 0; i < current.N; i++) {
			if (tuples[i] == row_idx) {
				result_mask.Set(result_idx, info_data[i]);
				break;
			} else if (tuples[i] > row_idx) {
				break;
			}
		}
	});
}